

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O2

void __thiscall Fl_Scroll::resize(Fl_Scroll *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Fl_Widget *this_00;
  Fl_Widget **ppFVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar7 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.h_;
  Fl_Widget::resize((Fl_Widget *)this,X,Y,W,H);
  fix_scrollbar_order(this);
  ppFVar6 = Fl_Group::array(&this->super_Fl_Group);
  iVar4 = (this->super_Fl_Group).children_;
  for (lVar9 = 0; iVar4 + -2 != (int)lVar9; lVar9 = lVar9 + 1) {
    this_00 = ppFVar6[lVar9];
    Fl_Widget::position(this_00,this_00->x_ + (X - iVar1),this_00->y_ + (Y - iVar7));
  }
  if ((iVar2 == W) && (iVar3 == H)) {
    uVar5 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
    uVar8 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ |
            (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
    uVar11 = uVar5 & 4;
    iVar1 = (W + X) - (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_;
    if (uVar11 != 0) {
      iVar1 = X;
    }
    uVar10 = 0;
    iVar7 = 0;
    if ((uVar8 & 2) == 0) {
      iVar7 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_;
    }
    if ((uVar5 & 1) == 0) {
      iVar7 = 0;
    }
    Fl_Widget::position((Fl_Widget *)&this->scrollbar,iVar1,iVar7 + Y);
    if ((uVar8 & 2) == 0) {
      uVar10 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_;
    }
    if (uVar11 == 0) {
      uVar10 = uVar11 >> 2;
    }
    iVar1 = (H + Y) - (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_;
    if ((uVar5 & 1) != 0) {
      iVar1 = Y;
    }
    Fl_Widget::position((Fl_Widget *)&this->hscrollbar,uVar10 + X,iVar1);
    return;
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Scroll::resize(int X, int Y, int W, int H) {
  int dx = X-x(), dy = Y-y();
  int dw = W-w(), dh = H-h();
  Fl_Widget::resize(X,Y,W,H); // resize _before_ moving children around
  fix_scrollbar_order();
  // move all the children:
  Fl_Widget*const* a = array();
  for (int i=children()-2; i--;) {
    Fl_Widget* o = *a++;
    o->position(o->x()+dx, o->y()+dy);
  }
  if (dw==0 && dh==0) {
    char pad = ( scrollbar.visible() && hscrollbar.visible() );
    char al = ( (scrollbar.align() & FL_ALIGN_LEFT) != 0 );
    char at = ( (scrollbar.align() & FL_ALIGN_TOP)  !=0 );
    scrollbar.position(al?X:X+W-scrollbar.w(), (at&&pad)?Y+hscrollbar.h():Y);
    hscrollbar.position((al&&pad)?X+scrollbar.w():X, at?Y:Y+H-hscrollbar.h());
  } else {
    // FIXME recalculation of scrollbars needs to be moved out of "draw()" (STR #1895)
    redraw(); // need full recalculation of scrollbars
  }
}